

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcmalloc_unittest.cc
# Opt level: O1

void __thiscall TCMallocTest_AllTests_Test::TestBody(TCMallocTest_AllTests_Test *this)

{
  undefined1 auVar1 [8];
  undefined8 uVar2;
  char cVar3;
  long lVar4;
  int *piVar5;
  TestingPortal *pTVar6;
  void *__ptr;
  long *plVar7;
  Cleanup<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_alk[P]gperftools_src_tests_tcmalloc_unittest_cc:1356:30)>
  *this_00;
  double *this_01;
  AssertHelper this_02;
  char *pcVar8;
  int s;
  size_t size;
  pair<int_*,_long> pVar9;
  undefined1 local_a8 [8];
  AllocatorState rnd;
  size_t actual_p1_size;
  void *p2;
  AssertHelper local_60;
  overaligned_type *poveraligned;
  void *p1;
  undefined1 auStack_48 [8];
  AssertionResult gtest_ar;
  
  rnd.super_TestHarness.types_.
  super__Vector_base<TestHarness::Type,_std::allocator<TestHarness::Type>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  rnd.super_TestHarness.types_.
  super__Vector_base<TestHarness::Type,_std::allocator<TestHarness::Type>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  rnd._vptr_AllocatorState = (_func_int **)0x0;
  rnd.super_TestHarness.types_.
  super__Vector_base<TestHarness::Type,_std::allocator<TestHarness::Type>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  srandom(100);
  local_a8 = (undefined1  [8])&PTR__AllocatorState_00162d20;
  rnd.super_TestHarness.total_weight_ = 0;
  rnd.super_TestHarness.num_tests_ = 0;
  lVar4 = random();
  rnd.super_TestHarness._24_8_ =
       ((double)((int)lVar4 +
                ((int)(SUB168(SEXT816(lVar4) * SEXT816(0x346dc5d63886594b),8) >> 0xb) -
                (SUB164(SEXT816(lVar4) * SEXT816(0x346dc5d63886594b),0xc) >> 0x1f)) * -10000) /
       10000.0) * 0.4 + 0.0;
  puts("Testing empty allocation");
  poveraligned = (overaligned_type *)AllocatorState::alloc((AllocatorState *)local_a8,0);
  actual_p1_size = 0;
  testing::internal::CmpHelperNE<void*,decltype(nullptr)>
            ((internal *)auStack_48,"p1","nullptr",&poveraligned,(void **)&actual_p1_size);
  if (auStack_48[0] == (internal)0x0) {
    testing::Message::Message((Message *)&actual_p1_size);
    if (gtest_ar._0_8_ == 0) {
      pcVar8 = "";
    }
    else {
      pcVar8 = *(char **)gtest_ar._0_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&rnd.memalign_fraction_,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/src/tests/tcmalloc_unittest.cc"
               ,0x520,pcVar8);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&rnd.memalign_fraction_,(Message *)&actual_p1_size);
LAB_001111a2:
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&rnd.memalign_fraction_);
    plVar7 = (long *)actual_p1_size;
  }
  else {
    if (gtest_ar._0_8_ != 0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&gtest_ar,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   gtest_ar._0_8_);
    }
    actual_p1_size = (size_t)AllocatorState::alloc((AllocatorState *)local_a8,0);
    rnd.memalign_fraction_ = 0.0;
    testing::internal::CmpHelperNE<void*,decltype(nullptr)>
              ((internal *)auStack_48,"p2","nullptr",(void **)&actual_p1_size,
               (void **)&rnd.memalign_fraction_);
    if (auStack_48[0] == (internal)0x0) {
      testing::Message::Message((Message *)&rnd.memalign_fraction_);
      if (gtest_ar._0_8_ == 0) {
        pcVar8 = "";
      }
      else {
        pcVar8 = *(char **)gtest_ar._0_8_;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_60,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/src/tests/tcmalloc_unittest.cc"
                 ,0x522,pcVar8);
      testing::internal::AssertHelper::operator=(&local_60,(Message *)&rnd.memalign_fraction_);
    }
    else {
      if (gtest_ar._0_8_ != 0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&gtest_ar,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     gtest_ar._0_8_);
      }
      testing::internal::CmpHelperNE<void*,void*>
                ((internal *)auStack_48,"p1","p2",&poveraligned,(void **)&actual_p1_size);
      if (auStack_48[0] != (internal)0x0) {
        if (gtest_ar._0_8_ != 0) {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&gtest_ar,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       gtest_ar._0_8_);
        }
        free(poveraligned);
        free((void *)actual_p1_size);
        puts("Testing STL use");
        auStack_48 = (undefined1  [8])0x0;
        gtest_ar.success_ = false;
        gtest_ar._1_7_ = 0;
        gtest_ar.message_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl =
             (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
              )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )0x0;
        poveraligned = (overaligned_type *)CONCAT44(poveraligned._4_4_,1);
        std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                  ((vector<int,_std::allocator<int>_> *)auStack_48,(iterator)0x0,
                   (int *)&poveraligned);
        poveraligned = (overaligned_type *)CONCAT44(poveraligned._4_4_,2);
        if ((__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
             )gtest_ar._0_8_ ==
            (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )gtest_ar.message_._M_t.
              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
              ._M_head_impl) {
          std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                    ((vector<int,_std::allocator<int>_> *)auStack_48,(iterator)gtest_ar._0_8_,
                     (int *)&poveraligned);
        }
        else {
          *(undefined4 *)gtest_ar._0_8_ = 2;
          gtest_ar._0_8_ = gtest_ar._0_8_ + 4;
        }
        poveraligned = (overaligned_type *)CONCAT44(poveraligned._4_4_,3);
        if ((__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
             )gtest_ar._0_8_ ==
            (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )gtest_ar.message_._M_t.
              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
              ._M_head_impl) {
          std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                    ((vector<int,_std::allocator<int>_> *)auStack_48,(iterator)gtest_ar._0_8_,
                     (int *)&poveraligned);
        }
        else {
          *(undefined4 *)gtest_ar._0_8_ = 3;
          gtest_ar._0_8_ = gtest_ar._0_8_ + 4;
        }
        poveraligned = (overaligned_type *)((ulong)poveraligned & 0xffffffff00000000);
        if ((__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
             )gtest_ar._0_8_ ==
            (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )gtest_ar.message_._M_t.
              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
              ._M_head_impl) {
          std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                    ((vector<int,_std::allocator<int>_> *)auStack_48,(iterator)gtest_ar._0_8_,
                     (int *)&poveraligned);
        }
        else {
          *(undefined4 *)gtest_ar._0_8_ = 0;
          gtest_ar._0_8_ = gtest_ar._0_8_ + 4;
        }
        uVar2 = gtest_ar._0_8_;
        auVar1 = auStack_48;
        if (auStack_48 != (undefined1  [8])gtest_ar._0_8_) {
          lVar4 = gtest_ar._0_8_ - (long)auStack_48 >> 2;
          pVar9 = std::get_temporary_buffer<int>((lVar4 - (lVar4 + 1 >> 0x3f)) + 1 >> 1);
          lVar4 = pVar9.second;
          piVar5 = pVar9.first;
          if (piVar5 == (int *)0x0) {
            std::
            __inplace_stable_sort<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__ops::_Iter_less_iter>
                      (auVar1,uVar2);
            lVar4 = 0;
          }
          else {
            std::
            __stable_sort_adaptive<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,int*,long,__gnu_cxx::__ops::_Iter_less_iter>
                      (auVar1,uVar2,piVar5,lVar4);
          }
          operator_delete(piVar5,lVar4 << 2);
        }
        if (auStack_48 != (undefined1  [8])0x0) {
          operator_delete((void *)auStack_48,
                          (long)gtest_ar.message_._M_t.
                                super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                .
                                super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                ._M_head_impl - (long)auStack_48);
        }
        puts("Sanity-testing all the memory allocation functions");
        SetNewHook();
        SetDeleteHook();
        auStack_48 = (undefined1  [8])malloc;
        (*noopt_helper)(auStack_48);
        actual_p1_size = (*(code *)auStack_48)(10);
        poveraligned = (overaligned_type *)0x0;
        testing::internal::CmpHelperNE<void*,decltype(nullptr)>
                  ((internal *)auStack_48,"p1","nullptr",(void **)&actual_p1_size,&poveraligned);
        if (auStack_48[0] == (internal)0x0) {
          testing::Message::Message((Message *)&poveraligned);
          if (gtest_ar._0_8_ == 0) {
            pcVar8 = "";
          }
          else {
            pcVar8 = *(char **)gtest_ar._0_8_;
          }
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&rnd.memalign_fraction_,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/src/tests/tcmalloc_unittest.cc"
                     ,0x554,pcVar8);
          testing::internal::AssertHelper::operator=
                    ((AssertHelper *)&rnd.memalign_fraction_,(Message *)&poveraligned);
          this_01 = &rnd.memalign_fraction_;
LAB_00112941:
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)this_01);
          this_02.data_ = (AssertHelperData *)poveraligned;
        }
        else {
          if (gtest_ar._0_8_ != 0) {
            std::
            default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)&gtest_ar,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         gtest_ar._0_8_);
          }
          VerifyNewHookWasCalled();
          rnd.memalign_fraction_ = (double)tc_malloc_size(actual_p1_size);
          poveraligned = (overaligned_type *)CONCAT44(poveraligned._4_4_,10);
          testing::internal::CmpHelperGE<unsigned_long,int>
                    ((internal *)auStack_48,"actual_p1_size","10",
                     (unsigned_long *)&rnd.memalign_fraction_,(int *)&poveraligned);
          if (auStack_48[0] == (internal)0x0) {
            testing::Message::Message((Message *)&poveraligned);
            if (gtest_ar._0_8_ == 0) {
              pcVar8 = "";
            }
            else {
              pcVar8 = *(char **)gtest_ar._0_8_;
            }
            testing::internal::AssertHelper::AssertHelper
                      (&local_60,kFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/src/tests/tcmalloc_unittest.cc"
                       ,0x558,pcVar8);
            testing::internal::AssertHelper::operator=(&local_60,(Message *)&poveraligned);
LAB_0011293d:
            this_01 = (double *)&local_60;
            goto LAB_00112941;
          }
          if (gtest_ar._0_8_ != 0) {
            std::
            default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)&gtest_ar,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         gtest_ar._0_8_);
          }
          poveraligned = (overaligned_type *)CONCAT44(poveraligned._4_4_,100000);
          testing::internal::CmpHelperLT<unsigned_long,int>
                    ((internal *)auStack_48,"actual_p1_size","100000",
                     (unsigned_long *)&rnd.memalign_fraction_,(int *)&poveraligned);
          if (auStack_48[0] == (internal)0x0) {
            testing::Message::Message((Message *)&poveraligned);
            if (gtest_ar._0_8_ == 0) {
              pcVar8 = "";
            }
            else {
              pcVar8 = *(char **)gtest_ar._0_8_;
            }
            testing::internal::AssertHelper::AssertHelper
                      (&local_60,kFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/src/tests/tcmalloc_unittest.cc"
                       ,0x559,pcVar8);
            testing::internal::AssertHelper::operator=(&local_60,(Message *)&poveraligned);
            goto LAB_0011293d;
          }
          if (gtest_ar._0_8_ != 0) {
            std::
            default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)&gtest_ar,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         gtest_ar._0_8_);
          }
          free((void *)actual_p1_size);
          VerifyDeleteHookWasCalled();
          auStack_48 = (undefined1  [8])malloc;
          (*noopt_helper)(auStack_48);
          actual_p1_size = (*(code *)auStack_48)(10);
          poveraligned = (overaligned_type *)0x0;
          testing::internal::CmpHelperNE<void*,decltype(nullptr)>
                    ((internal *)auStack_48,"p1","nullptr",(void **)&actual_p1_size,&poveraligned);
          if (auStack_48[0] == (internal)0x0) {
            testing::Message::Message((Message *)&poveraligned);
            if (gtest_ar._0_8_ == 0) {
              pcVar8 = "";
            }
            else {
              pcVar8 = *(char **)gtest_ar._0_8_;
            }
            testing::internal::AssertHelper::AssertHelper
                      (&local_60,kFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/src/tests/tcmalloc_unittest.cc"
                       ,0x55e,pcVar8);
            testing::internal::AssertHelper::operator=(&local_60,(Message *)&poveraligned);
            goto LAB_0011293d;
          }
          if (gtest_ar._0_8_ != 0) {
            std::
            default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)&gtest_ar,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         gtest_ar._0_8_);
          }
          VerifyNewHookWasCalled();
          tc_free_sized(actual_p1_size,10);
          VerifyDeleteHookWasCalled();
          auStack_48 = (undefined1  [8])tc_memalign;
          (*noopt_helper)(auStack_48);
          actual_p1_size = (*(code *)auStack_48)(1,10);
          poveraligned = (overaligned_type *)0x0;
          testing::internal::CmpHelperNE<void*,decltype(nullptr)>
                    ((internal *)auStack_48,"p1","nullptr",(void **)&actual_p1_size,&poveraligned);
          if (auStack_48[0] == (internal)0x0) {
            testing::Message::Message((Message *)&poveraligned);
            if (gtest_ar._0_8_ == 0) {
              pcVar8 = "";
            }
            else {
              pcVar8 = *(char **)gtest_ar._0_8_;
            }
            testing::internal::AssertHelper::AssertHelper
                      (&local_60,kFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/src/tests/tcmalloc_unittest.cc"
                       ,0x566,pcVar8);
            testing::internal::AssertHelper::operator=(&local_60,(Message *)&poveraligned);
            goto LAB_0011293d;
          }
          if (gtest_ar._0_8_ != 0) {
            std::
            default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)&gtest_ar,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         gtest_ar._0_8_);
          }
          VerifyNewHookWasCalled();
          tc_free_aligned_sized(actual_p1_size,1,10);
          VerifyDeleteHookWasCalled();
          actual_p1_size = tc_malloc_skip_new_handler(10);
          poveraligned = (overaligned_type *)0x0;
          testing::internal::CmpHelperNE<void*,decltype(nullptr)>
                    ((internal *)auStack_48,"p1","nullptr",(void **)&actual_p1_size,&poveraligned);
          if (auStack_48[0] == (internal)0x0) {
            testing::Message::Message((Message *)&poveraligned);
            if (gtest_ar._0_8_ == 0) {
              pcVar8 = "";
            }
            else {
              pcVar8 = *(char **)gtest_ar._0_8_;
            }
            testing::internal::AssertHelper::AssertHelper
                      (&local_60,kFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/src/tests/tcmalloc_unittest.cc"
                       ,0x56c,pcVar8);
            testing::internal::AssertHelper::operator=(&local_60,(Message *)&poveraligned);
            goto LAB_0011293d;
          }
          if (gtest_ar._0_8_ != 0) {
            std::
            default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)&gtest_ar,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         gtest_ar._0_8_);
          }
          VerifyNewHookWasCalled();
          free((void *)actual_p1_size);
          VerifyDeleteHookWasCalled();
          auStack_48 = (undefined1  [8])calloc;
          (*noopt_helper)(auStack_48);
          actual_p1_size = (*(code *)auStack_48)(10,2);
          poveraligned = (overaligned_type *)0x0;
          testing::internal::CmpHelperNE<void*,decltype(nullptr)>
                    ((internal *)auStack_48,"p1","nullptr",(void **)&actual_p1_size,&poveraligned);
          if (auStack_48[0] == (internal)0x0) {
            testing::Message::Message((Message *)&poveraligned);
            if (gtest_ar._0_8_ == 0) {
              pcVar8 = "";
            }
            else {
              pcVar8 = *(char **)gtest_ar._0_8_;
            }
            testing::internal::AssertHelper::AssertHelper
                      (&local_60,kFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/src/tests/tcmalloc_unittest.cc"
                       ,0x572,pcVar8);
            testing::internal::AssertHelper::operator=(&local_60,(Message *)&poveraligned);
            goto LAB_0011293d;
          }
          if (gtest_ar._0_8_ != 0) {
            std::
            default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)&gtest_ar,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         gtest_ar._0_8_);
          }
          VerifyNewHookWasCalled();
          auStack_48 = (undefined1  [8])realloc;
          (*noopt_helper)(auStack_48);
          actual_p1_size = (*(code *)auStack_48)(actual_p1_size,30000);
          poveraligned = (overaligned_type *)0x0;
          testing::internal::CmpHelperNE<void*,decltype(nullptr)>
                    ((internal *)auStack_48,"p1","nullptr",(void **)&actual_p1_size,&poveraligned);
          if (auStack_48[0] == (internal)0x0) {
            testing::Message::Message((Message *)&poveraligned);
            if (gtest_ar._0_8_ == 0) {
              pcVar8 = "";
            }
            else {
              pcVar8 = *(char **)gtest_ar._0_8_;
            }
            testing::internal::AssertHelper::AssertHelper
                      (&local_60,kFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/src/tests/tcmalloc_unittest.cc"
                       ,0x578,pcVar8);
            testing::internal::AssertHelper::operator=(&local_60,(Message *)&poveraligned);
            goto LAB_0011293d;
          }
          if (gtest_ar._0_8_ != 0) {
            std::
            default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)&gtest_ar,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         gtest_ar._0_8_);
          }
          VerifyNewHookWasCalled();
          VerifyDeleteHookWasCalled();
          free((void *)actual_p1_size);
          VerifyDeleteHookWasCalled();
          poveraligned = (overaligned_type *)PosixMemalign;
          (*noopt_helper)(&poveraligned);
          local_60.data_._0_4_ = (*(code *)poveraligned)(&actual_p1_size,8,0x28);
          poveraligned = (overaligned_type *)((ulong)poveraligned & 0xffffffff00000000);
          testing::internal::CmpHelperEQ<int,int>
                    ((internal *)auStack_48,"noopt(PosixMemalign)(&p1, sizeof(p1), 40)","0",
                     (int *)&local_60,(int *)&poveraligned);
          if (auStack_48[0] == (internal)0x0) {
            testing::Message::Message((Message *)&poveraligned);
            if (gtest_ar._0_8_ == 0) {
              pcVar8 = "";
            }
            else {
              pcVar8 = *(char **)gtest_ar._0_8_;
            }
            testing::internal::AssertHelper::AssertHelper
                      (&local_60,kFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/src/tests/tcmalloc_unittest.cc"
                       ,0x57f,pcVar8);
            testing::internal::AssertHelper::operator=(&local_60,(Message *)&poveraligned);
            goto LAB_0011293d;
          }
          if (gtest_ar._0_8_ != 0) {
            std::
            default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)&gtest_ar,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         gtest_ar._0_8_);
          }
          poveraligned = (overaligned_type *)0x0;
          testing::internal::CmpHelperNE<void*,decltype(nullptr)>
                    ((internal *)auStack_48,"p1","nullptr",(void **)&actual_p1_size,&poveraligned);
          if (auStack_48[0] == (internal)0x0) {
            testing::Message::Message((Message *)&poveraligned);
            if (gtest_ar._0_8_ == 0) {
              pcVar8 = "";
            }
            else {
              pcVar8 = *(char **)gtest_ar._0_8_;
            }
            testing::internal::AssertHelper::AssertHelper
                      (&local_60,kFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/src/tests/tcmalloc_unittest.cc"
                       ,0x580,pcVar8);
            testing::internal::AssertHelper::operator=(&local_60,(Message *)&poveraligned);
            goto LAB_0011293d;
          }
          if (gtest_ar._0_8_ != 0) {
            std::
            default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)&gtest_ar,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         gtest_ar._0_8_);
          }
          VerifyNewHookWasCalled();
          free((void *)actual_p1_size);
          VerifyDeleteHookWasCalled();
          auStack_48 = (undefined1  [8])Memalign;
          (*noopt_helper)(auStack_48);
          actual_p1_size = (*(code *)auStack_48)(0x10,0x32);
          poveraligned = (overaligned_type *)0x0;
          testing::internal::CmpHelperNE<void*,decltype(nullptr)>
                    ((internal *)auStack_48,"p1","nullptr",(void **)&actual_p1_size,&poveraligned);
          if (auStack_48[0] == (internal)0x0) {
            testing::Message::Message((Message *)&poveraligned);
            if (gtest_ar._0_8_ == 0) {
              pcVar8 = "";
            }
            else {
              pcVar8 = *(char **)gtest_ar._0_8_;
            }
            testing::internal::AssertHelper::AssertHelper
                      (&local_60,kFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/src/tests/tcmalloc_unittest.cc"
                       ,0x586,pcVar8);
            testing::internal::AssertHelper::operator=(&local_60,(Message *)&poveraligned);
            goto LAB_0011293d;
          }
          if (gtest_ar._0_8_ != 0) {
            std::
            default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)&gtest_ar,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         gtest_ar._0_8_);
          }
          VerifyNewHookWasCalled();
          free((void *)actual_p1_size);
          VerifyDeleteHookWasCalled();
          auStack_48 = (undefined1  [8])valloc(0x3c);
          (*noopt_helper)(auStack_48);
          actual_p1_size = (size_t)auStack_48;
          poveraligned = (overaligned_type *)0x0;
          testing::internal::CmpHelperNE<void*,decltype(nullptr)>
                    ((internal *)auStack_48,"p1","nullptr",(void **)&actual_p1_size,&poveraligned);
          if (auStack_48[0] == (internal)0x0) {
            testing::Message::Message((Message *)&poveraligned);
            if (gtest_ar._0_8_ == 0) {
              pcVar8 = "";
            }
            else {
              pcVar8 = *(char **)gtest_ar._0_8_;
            }
            testing::internal::AssertHelper::AssertHelper
                      (&local_60,kFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/src/tests/tcmalloc_unittest.cc"
                       ,0x596,pcVar8);
            testing::internal::AssertHelper::operator=(&local_60,(Message *)&poveraligned);
            goto LAB_0011293d;
          }
          if (gtest_ar._0_8_ != 0) {
            std::
            default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)&gtest_ar,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         gtest_ar._0_8_);
          }
          VerifyNewHookWasCalled();
          free((void *)actual_p1_size);
          VerifyDeleteHookWasCalled();
          auStack_48 = (undefined1  [8])pvalloc(0x46);
          (*noopt_helper)(auStack_48);
          actual_p1_size = (size_t)auStack_48;
          poveraligned = (overaligned_type *)0x0;
          testing::internal::CmpHelperNE<void*,decltype(nullptr)>
                    ((internal *)auStack_48,"p1","nullptr",(void **)&actual_p1_size,&poveraligned);
          if (auStack_48[0] == (internal)0x0) {
            testing::Message::Message((Message *)&poveraligned);
            if (gtest_ar._0_8_ == 0) {
              pcVar8 = "";
            }
            else {
              pcVar8 = *(char **)gtest_ar._0_8_;
            }
            testing::internal::AssertHelper::AssertHelper
                      (&local_60,kFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/src/tests/tcmalloc_unittest.cc"
                       ,0x59c,pcVar8);
            testing::internal::AssertHelper::operator=(&local_60,(Message *)&poveraligned);
            goto LAB_0011293d;
          }
          if (gtest_ar._0_8_ != 0) {
            std::
            default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)&gtest_ar,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         gtest_ar._0_8_);
          }
          VerifyNewHookWasCalled();
          free((void *)actual_p1_size);
          VerifyDeleteHookWasCalled();
          auStack_48 = (undefined1  [8])operator_new(1);
          (*noopt_helper)(auStack_48);
          poveraligned = (overaligned_type *)auStack_48;
          local_60.data_ = (AssertHelperData *)0x0;
          testing::internal::CmpHelperNE<char*,decltype(nullptr)>
                    ((internal *)auStack_48,"p2","nullptr",(char **)&poveraligned,&local_60.data_);
          if (auStack_48[0] == (internal)0x0) {
            testing::Message::Message((Message *)&local_60);
            if (gtest_ar._0_8_ == 0) {
              pcVar8 = "";
            }
            else {
              pcVar8 = *(char **)gtest_ar._0_8_;
            }
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)&p1,kFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/src/tests/tcmalloc_unittest.cc"
                       ,0x5a2,pcVar8);
            testing::internal::AssertHelper::operator=((AssertHelper *)&p1,(Message *)&local_60);
LAB_00112b25:
            testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&p1);
            this_02.data_ = local_60.data_;
          }
          else {
            if (gtest_ar._0_8_ != 0) {
              std::
              default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)&gtest_ar,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           gtest_ar._0_8_);
            }
            VerifyNewHookWasCalled();
            if (poveraligned != (overaligned_type *)0x0) {
              operator_delete(poveraligned,1);
            }
            VerifyDeleteHookWasCalled();
            auStack_48 = (undefined1  [8])operator_new__(100);
            (*noopt_helper)(auStack_48);
            poveraligned = (overaligned_type *)auStack_48;
            local_60.data_ = (AssertHelperData *)0x0;
            testing::internal::CmpHelperNE<char*,decltype(nullptr)>
                      ((internal *)auStack_48,"p2","nullptr",(char **)&poveraligned,&local_60.data_)
            ;
            if (auStack_48[0] == (internal)0x0) {
              testing::Message::Message((Message *)&local_60);
              if (gtest_ar._0_8_ == 0) {
                pcVar8 = "";
              }
              else {
                pcVar8 = *(char **)gtest_ar._0_8_;
              }
              testing::internal::AssertHelper::AssertHelper
                        ((AssertHelper *)&p1,kFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/src/tests/tcmalloc_unittest.cc"
                         ,0x5a8,pcVar8);
              testing::internal::AssertHelper::operator=((AssertHelper *)&p1,(Message *)&local_60);
              goto LAB_00112b25;
            }
            if (gtest_ar._0_8_ != 0) {
              std::
              default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)&gtest_ar,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           gtest_ar._0_8_);
            }
            VerifyNewHookWasCalled();
            if (poveraligned != (overaligned_type *)0x0) {
              operator_delete__(poveraligned);
            }
            VerifyDeleteHookWasCalled();
            auStack_48 = (undefined1  [8])operator_new(1,(nothrow_t *)&std::nothrow);
            (*noopt_helper)(auStack_48);
            poveraligned = (overaligned_type *)auStack_48;
            local_60.data_ = (AssertHelperData *)0x0;
            testing::internal::CmpHelperNE<char*,decltype(nullptr)>
                      ((internal *)auStack_48,"p2","nullptr",(char **)&poveraligned,&local_60.data_)
            ;
            if (auStack_48[0] == (internal)0x0) {
              testing::Message::Message((Message *)&local_60);
              if (gtest_ar._0_8_ == 0) {
                pcVar8 = "";
              }
              else {
                pcVar8 = *(char **)gtest_ar._0_8_;
              }
              testing::internal::AssertHelper::AssertHelper
                        ((AssertHelper *)&p1,kFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/src/tests/tcmalloc_unittest.cc"
                         ,0x5ae,pcVar8);
              testing::internal::AssertHelper::operator=((AssertHelper *)&p1,(Message *)&local_60);
              goto LAB_00112b25;
            }
            if (gtest_ar._0_8_ != 0) {
              std::
              default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)&gtest_ar,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           gtest_ar._0_8_);
            }
            VerifyNewHookWasCalled();
            if (poveraligned != (overaligned_type *)0x0) {
              operator_delete(poveraligned,1);
            }
            VerifyDeleteHookWasCalled();
            auStack_48 = (undefined1  [8])operator_new__(100,(nothrow_t *)&std::nothrow);
            (*noopt_helper)(auStack_48);
            poveraligned = (overaligned_type *)auStack_48;
            local_60.data_ = (AssertHelperData *)0x0;
            testing::internal::CmpHelperNE<char*,decltype(nullptr)>
                      ((internal *)auStack_48,"p2","nullptr",(char **)&poveraligned,&local_60.data_)
            ;
            if (auStack_48[0] == (internal)0x0) {
              testing::Message::Message((Message *)&local_60);
              if (gtest_ar._0_8_ == 0) {
                pcVar8 = "";
              }
              else {
                pcVar8 = *(char **)gtest_ar._0_8_;
              }
              testing::internal::AssertHelper::AssertHelper
                        ((AssertHelper *)&p1,kFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/src/tests/tcmalloc_unittest.cc"
                         ,0x5b4,pcVar8);
              testing::internal::AssertHelper::operator=((AssertHelper *)&p1,(Message *)&local_60);
              goto LAB_00112b25;
            }
            if (gtest_ar._0_8_ != 0) {
              std::
              default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)&gtest_ar,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           gtest_ar._0_8_);
            }
            VerifyNewHookWasCalled();
            if (poveraligned != (overaligned_type *)0x0) {
              operator_delete__(poveraligned);
            }
            VerifyDeleteHookWasCalled();
            auStack_48 = (undefined1  [8])operator_new(100);
            (*noopt_helper)(auStack_48);
            poveraligned = (overaligned_type *)auStack_48;
            local_60.data_ = (AssertHelperData *)0x0;
            testing::internal::CmpHelperNE<char*,decltype(nullptr)>
                      ((internal *)auStack_48,"p2","nullptr",(char **)&poveraligned,&local_60.data_)
            ;
            if (auStack_48[0] == (internal)0x0) {
              testing::Message::Message((Message *)&local_60);
              if (gtest_ar._0_8_ == 0) {
                pcVar8 = "";
              }
              else {
                pcVar8 = *(char **)gtest_ar._0_8_;
              }
              testing::internal::AssertHelper::AssertHelper
                        ((AssertHelper *)&p1,kFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/src/tests/tcmalloc_unittest.cc"
                         ,0x5bb,pcVar8);
              testing::internal::AssertHelper::operator=((AssertHelper *)&p1,(Message *)&local_60);
              goto LAB_00112b25;
            }
            if (gtest_ar._0_8_ != 0) {
              std::
              default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)&gtest_ar,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           gtest_ar._0_8_);
            }
            VerifyNewHookWasCalled();
            operator_delete(poveraligned);
            VerifyDeleteHookWasCalled();
            auStack_48 = (undefined1  [8])operator_new(100,(nothrow_t *)&std::nothrow);
            (*noopt_helper)(auStack_48);
            poveraligned = (overaligned_type *)auStack_48;
            local_60.data_ = (AssertHelperData *)0x0;
            testing::internal::CmpHelperNE<char*,decltype(nullptr)>
                      ((internal *)auStack_48,"p2","nullptr",(char **)&poveraligned,&local_60.data_)
            ;
            if (auStack_48[0] == (internal)0x0) {
              testing::Message::Message((Message *)&local_60);
              if (gtest_ar._0_8_ == 0) {
                pcVar8 = "";
              }
              else {
                pcVar8 = *(char **)gtest_ar._0_8_;
              }
              testing::internal::AssertHelper::AssertHelper
                        ((AssertHelper *)&p1,kFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/src/tests/tcmalloc_unittest.cc"
                         ,0x5c2,pcVar8);
              testing::internal::AssertHelper::operator=((AssertHelper *)&p1,(Message *)&local_60);
              goto LAB_00112b25;
            }
            if (gtest_ar._0_8_ != 0) {
              std::
              default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)&gtest_ar,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           gtest_ar._0_8_);
            }
            VerifyNewHookWasCalled();
            operator_delete(poveraligned,(nothrow_t *)&std::nothrow);
            VerifyDeleteHookWasCalled();
            auStack_48 = (undefined1  [8])operator_new(0x80,0x40);
            (*noopt_helper)(auStack_48);
            local_60.data_ = (AssertHelperData *)auStack_48;
            p1 = (void *)0x0;
            testing::internal::CmpHelperNE<overaligned_type*,decltype(nullptr)>
                      ((internal *)auStack_48,"poveraligned","nullptr",
                       (overaligned_type **)&local_60,&p1);
            if (auStack_48[0] == (internal)0x0) {
              testing::Message::Message((Message *)&p1);
              if (gtest_ar._0_8_ == 0) {
                pcVar8 = "";
              }
              else {
                pcVar8 = *(char **)gtest_ar._0_8_;
              }
              testing::internal::AssertHelper::AssertHelper
                        ((AssertHelper *)&p2,kFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/src/tests/tcmalloc_unittest.cc"
                         ,0x5d6,pcVar8);
              testing::internal::AssertHelper::operator=((AssertHelper *)&p2,(Message *)&p1);
            }
            else {
              if (gtest_ar._0_8_ != 0) {
                std::
                default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              *)&gtest_ar,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             gtest_ar._0_8_);
              }
              p1 = (void *)(ulong)((uint)local_60.data_ & 0x3f);
              p2._0_4_ = 0;
              testing::internal::CmpHelperEQ<unsigned_long,int>
                        ((internal *)auStack_48,"(((size_t)poveraligned) % kOveralignment)","0",
                         (unsigned_long *)&p1,(int *)&p2);
              if (auStack_48[0] == (internal)0x0) {
                testing::Message::Message((Message *)&p1);
                if (gtest_ar._0_8_ == 0) {
                  pcVar8 = "";
                }
                else {
                  pcVar8 = *(char **)gtest_ar._0_8_;
                }
                testing::internal::AssertHelper::AssertHelper
                          ((AssertHelper *)&p2,kFatalFailure,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/src/tests/tcmalloc_unittest.cc"
                           ,0x5d7,pcVar8);
                testing::internal::AssertHelper::operator=((AssertHelper *)&p2,(Message *)&p1);
              }
              else {
                if (gtest_ar._0_8_ != 0) {
                  std::
                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                *)&gtest_ar,
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               gtest_ar._0_8_);
                }
                VerifyNewHookWasCalled();
                if (local_60.data_ != (AssertHelperData *)0x0) {
                  operator_delete(local_60.data_,0x80,0x40);
                }
                VerifyDeleteHookWasCalled();
                auStack_48 = (undefined1  [8])operator_new__(0x500,0x40);
                (*noopt_helper)(auStack_48);
                local_60.data_ = (AssertHelperData *)auStack_48;
                p1 = (void *)0x0;
                testing::internal::CmpHelperNE<overaligned_type*,decltype(nullptr)>
                          ((internal *)auStack_48,"poveraligned","nullptr",
                           (overaligned_type **)&local_60,&p1);
                if (auStack_48[0] == (internal)0x0) {
                  testing::Message::Message((Message *)&p1);
                  if (gtest_ar._0_8_ == 0) {
                    pcVar8 = "";
                  }
                  else {
                    pcVar8 = *(char **)gtest_ar._0_8_;
                  }
                  testing::internal::AssertHelper::AssertHelper
                            ((AssertHelper *)&p2,kFatalFailure,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/src/tests/tcmalloc_unittest.cc"
                             ,0x5dd,pcVar8);
                  testing::internal::AssertHelper::operator=((AssertHelper *)&p2,(Message *)&p1);
                }
                else {
                  if (gtest_ar._0_8_ != 0) {
                    std::
                    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                  *)&gtest_ar,
                                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)gtest_ar._0_8_);
                  }
                  p1 = (void *)(ulong)((uint)local_60.data_ & 0x3f);
                  p2._0_4_ = 0;
                  testing::internal::CmpHelperEQ<unsigned_long,int>
                            ((internal *)auStack_48,"(((size_t)poveraligned) % kOveralignment)","0",
                             (unsigned_long *)&p1,(int *)&p2);
                  if (auStack_48[0] == (internal)0x0) {
                    testing::Message::Message((Message *)&p1);
                    if (gtest_ar._0_8_ == 0) {
                      pcVar8 = "";
                    }
                    else {
                      pcVar8 = *(char **)gtest_ar._0_8_;
                    }
                    testing::internal::AssertHelper::AssertHelper
                              ((AssertHelper *)&p2,kFatalFailure,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/src/tests/tcmalloc_unittest.cc"
                               ,0x5de,pcVar8);
                    testing::internal::AssertHelper::operator=((AssertHelper *)&p2,(Message *)&p1);
                  }
                  else {
                    if (gtest_ar._0_8_ != 0) {
                      std::
                      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                    *)&gtest_ar,
                                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)gtest_ar._0_8_);
                    }
                    VerifyNewHookWasCalled();
                    if (local_60.data_ != (AssertHelperData *)0x0) {
                      operator_delete__(local_60.data_,0x40);
                    }
                    VerifyDeleteHookWasCalled();
                    auStack_48 = (undefined1  [8])operator_new(0x80,0x40,(nothrow_t *)&std::nothrow)
                    ;
                    (*noopt_helper)(auStack_48);
                    local_60.data_ = (AssertHelperData *)auStack_48;
                    p1 = (void *)0x0;
                    testing::internal::CmpHelperNE<overaligned_type*,decltype(nullptr)>
                              ((internal *)auStack_48,"poveraligned","nullptr",
                               (overaligned_type **)&local_60,&p1);
                    if (auStack_48[0] == (internal)0x0) {
                      testing::Message::Message((Message *)&p1);
                      if (gtest_ar._0_8_ == 0) {
                        pcVar8 = "";
                      }
                      else {
                        pcVar8 = *(char **)gtest_ar._0_8_;
                      }
                      testing::internal::AssertHelper::AssertHelper
                                ((AssertHelper *)&p2,kFatalFailure,
                                 "/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/src/tests/tcmalloc_unittest.cc"
                                 ,0x5e4,pcVar8);
                      testing::internal::AssertHelper::operator=((AssertHelper *)&p2,(Message *)&p1)
                      ;
                    }
                    else {
                      if (gtest_ar._0_8_ != 0) {
                        std::
                        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                      *)&gtest_ar,
                                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)gtest_ar._0_8_);
                      }
                      p1 = (void *)(ulong)((uint)local_60.data_ & 0x3f);
                      p2._0_4_ = 0;
                      testing::internal::CmpHelperEQ<unsigned_long,int>
                                ((internal *)auStack_48,"(((size_t)poveraligned) % kOveralignment)",
                                 "0",(unsigned_long *)&p1,(int *)&p2);
                      if (auStack_48[0] == (internal)0x0) {
                        testing::Message::Message((Message *)&p1);
                        if (gtest_ar._0_8_ == 0) {
                          pcVar8 = "";
                        }
                        else {
                          pcVar8 = *(char **)gtest_ar._0_8_;
                        }
                        testing::internal::AssertHelper::AssertHelper
                                  ((AssertHelper *)&p2,kFatalFailure,
                                   "/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/src/tests/tcmalloc_unittest.cc"
                                   ,0x5e5,pcVar8);
                        testing::internal::AssertHelper::operator=
                                  ((AssertHelper *)&p2,(Message *)&p1);
                      }
                      else {
                        if (gtest_ar._0_8_ != 0) {
                          std::
                          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                        *)&gtest_ar,
                                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)gtest_ar._0_8_);
                        }
                        VerifyNewHookWasCalled();
                        if (local_60.data_ != (AssertHelperData *)0x0) {
                          operator_delete(local_60.data_,0x80,0x40);
                        }
                        VerifyDeleteHookWasCalled();
                        auStack_48 = (undefined1  [8])
                                     operator_new__(0x500,0x40,(nothrow_t *)&std::nothrow);
                        (*noopt_helper)(auStack_48);
                        local_60.data_ = (AssertHelperData *)auStack_48;
                        p1 = (void *)0x0;
                        testing::internal::CmpHelperNE<overaligned_type*,decltype(nullptr)>
                                  ((internal *)auStack_48,"poveraligned","nullptr",
                                   (overaligned_type **)&local_60,&p1);
                        if (auStack_48[0] == (internal)0x0) {
                          testing::Message::Message((Message *)&p1);
                          if (gtest_ar._0_8_ == 0) {
                            pcVar8 = "";
                          }
                          else {
                            pcVar8 = *(char **)gtest_ar._0_8_;
                          }
                          testing::internal::AssertHelper::AssertHelper
                                    ((AssertHelper *)&p2,kFatalFailure,
                                     "/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/src/tests/tcmalloc_unittest.cc"
                                     ,0x5eb,pcVar8);
                          testing::internal::AssertHelper::operator=
                                    ((AssertHelper *)&p2,(Message *)&p1);
                        }
                        else {
                          if (gtest_ar._0_8_ != 0) {
                            std::
                            default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                          *)&gtest_ar,
                                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                          *)gtest_ar._0_8_);
                          }
                          p1 = (void *)(ulong)((uint)local_60.data_ & 0x3f);
                          p2._0_4_ = 0;
                          testing::internal::CmpHelperEQ<unsigned_long,int>
                                    ((internal *)auStack_48,
                                     "(((size_t)poveraligned) % kOveralignment)","0",
                                     (unsigned_long *)&p1,(int *)&p2);
                          if (auStack_48[0] == (internal)0x0) {
                            testing::Message::Message((Message *)&p1);
                            if (gtest_ar._0_8_ == 0) {
                              pcVar8 = "";
                            }
                            else {
                              pcVar8 = *(char **)gtest_ar._0_8_;
                            }
                            testing::internal::AssertHelper::AssertHelper
                                      ((AssertHelper *)&p2,kFatalFailure,
                                       "/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/src/tests/tcmalloc_unittest.cc"
                                       ,0x5ec,pcVar8);
                            testing::internal::AssertHelper::operator=
                                      ((AssertHelper *)&p2,(Message *)&p1);
                          }
                          else {
                            if (gtest_ar._0_8_ != 0) {
                              std::
                              default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                            *)&gtest_ar,
                                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                            *)gtest_ar._0_8_);
                            }
                            VerifyNewHookWasCalled();
                            if (local_60.data_ != (AssertHelperData *)0x0) {
                              operator_delete__(local_60.data_,0x40);
                            }
                            VerifyDeleteHookWasCalled();
                            auStack_48 = (undefined1  [8])operator_new(100,0x40);
                            (*noopt_helper)(auStack_48);
                            poveraligned = (overaligned_type *)auStack_48;
                            p1 = (void *)0x0;
                            testing::internal::CmpHelperNE<char*,decltype(nullptr)>
                                      ((internal *)auStack_48,"p2","nullptr",(char **)&poveraligned,
                                       &p1);
                            if (auStack_48[0] == (internal)0x0) {
                              testing::Message::Message((Message *)&p1);
                              if (gtest_ar._0_8_ == 0) {
                                pcVar8 = "";
                              }
                              else {
                                pcVar8 = *(char **)gtest_ar._0_8_;
                              }
                              testing::internal::AssertHelper::AssertHelper
                                        ((AssertHelper *)&p2,kFatalFailure,
                                         "/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/src/tests/tcmalloc_unittest.cc"
                                         ,0x5f3,pcVar8);
                              testing::internal::AssertHelper::operator=
                                        ((AssertHelper *)&p2,(Message *)&p1);
                            }
                            else {
                              if (gtest_ar._0_8_ != 0) {
                                std::
                                default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                              *)&gtest_ar,
                                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                              *)gtest_ar._0_8_);
                              }
                              p1 = (void *)(ulong)((uint)poveraligned & 0x3f);
                              p2._0_4_ = 0;
                              testing::internal::CmpHelperEQ<unsigned_long,int>
                                        ((internal *)auStack_48,"(((size_t)p2) % kOveralignment)",
                                         "0",(unsigned_long *)&p1,(int *)&p2);
                              if (auStack_48[0] == (internal)0x0) {
                                testing::Message::Message((Message *)&p1);
                                if (gtest_ar._0_8_ == 0) {
                                  pcVar8 = "";
                                }
                                else {
                                  pcVar8 = *(char **)gtest_ar._0_8_;
                                }
                                testing::internal::AssertHelper::AssertHelper
                                          ((AssertHelper *)&p2,kFatalFailure,
                                           "/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/src/tests/tcmalloc_unittest.cc"
                                           ,0x5f4,pcVar8);
                                testing::internal::AssertHelper::operator=
                                          ((AssertHelper *)&p2,(Message *)&p1);
                              }
                              else {
                                if (gtest_ar._0_8_ != 0) {
                                  std::
                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                  ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                *)&gtest_ar,
                                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                *)gtest_ar._0_8_);
                                }
                                VerifyNewHookWasCalled();
                                operator_delete(poveraligned,0x40);
                                VerifyDeleteHookWasCalled();
                                auStack_48 = (undefined1  [8])
                                             operator_new(100,0x40,(nothrow_t *)&std::nothrow);
                                (*noopt_helper)(auStack_48);
                                poveraligned = (overaligned_type *)auStack_48;
                                p1 = (void *)0x0;
                                testing::internal::CmpHelperNE<char*,decltype(nullptr)>
                                          ((internal *)auStack_48,"p2","nullptr",
                                           (char **)&poveraligned,&p1);
                                if (auStack_48[0] == (internal)0x0) {
                                  testing::Message::Message((Message *)&p1);
                                  if (gtest_ar._0_8_ == 0) {
                                    pcVar8 = "";
                                  }
                                  else {
                                    pcVar8 = *(char **)gtest_ar._0_8_;
                                  }
                                  testing::internal::AssertHelper::AssertHelper
                                            ((AssertHelper *)&p2,kFatalFailure,
                                             "/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/src/tests/tcmalloc_unittest.cc"
                                             ,0x5fa,pcVar8);
                                  testing::internal::AssertHelper::operator=
                                            ((AssertHelper *)&p2,(Message *)&p1);
                                }
                                else {
                                  if (gtest_ar._0_8_ != 0) {
                                    std::
                                    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&gtest_ar,
                                                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)gtest_ar._0_8_);
                                  }
                                  p1 = (void *)(ulong)((uint)poveraligned & 0x3f);
                                  p2._0_4_ = 0;
                                  testing::internal::CmpHelperEQ<unsigned_long,int>
                                            ((internal *)auStack_48,
                                             "(((size_t)p2) % kOveralignment)","0",
                                             (unsigned_long *)&p1,(int *)&p2);
                                  if (auStack_48[0] == (internal)0x0) {
                                    testing::Message::Message((Message *)&p1);
                                    if (gtest_ar._0_8_ == 0) {
                                      pcVar8 = "";
                                    }
                                    else {
                                      pcVar8 = *(char **)gtest_ar._0_8_;
                                    }
                                    testing::internal::AssertHelper::AssertHelper
                                              ((AssertHelper *)&p2,kFatalFailure,
                                               "/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/src/tests/tcmalloc_unittest.cc"
                                               ,0x5fb,pcVar8);
                                    testing::internal::AssertHelper::operator=
                                              ((AssertHelper *)&p2,(Message *)&p1);
                                  }
                                  else {
                                    if (gtest_ar._0_8_ != 0) {
                                      std::
                                      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                      ::operator()((
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&gtest_ar,
                                                  (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)gtest_ar._0_8_);
                                    }
                                    VerifyNewHookWasCalled();
                                    operator_delete(poveraligned,0x40,(nothrow_t *)&std::nothrow);
                                    VerifyDeleteHookWasCalled();
                                    auStack_48 = (undefined1  [8])operator_new(0x80,0x40);
                                    (*noopt_helper)(auStack_48);
                                    local_60.data_ = (AssertHelperData *)auStack_48;
                                    p1 = (void *)0x0;
                                    testing::internal::
                                    CmpHelperNE<overaligned_type*,decltype(nullptr)>
                                              ((internal *)auStack_48,"poveraligned","nullptr",
                                               (overaligned_type **)&local_60,&p1);
                                    if (auStack_48[0] == (internal)0x0) {
                                      testing::Message::Message((Message *)&p1);
                                      if (gtest_ar._0_8_ == 0) {
                                        pcVar8 = "";
                                      }
                                      else {
                                        pcVar8 = *(char **)gtest_ar._0_8_;
                                      }
                                      testing::internal::AssertHelper::AssertHelper
                                                ((AssertHelper *)&p2,kFatalFailure,
                                                 "/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/src/tests/tcmalloc_unittest.cc"
                                                 ,0x601,pcVar8);
                                      testing::internal::AssertHelper::operator=
                                                ((AssertHelper *)&p2,(Message *)&p1);
                                    }
                                    else {
                                      if (gtest_ar._0_8_ != 0) {
                                        std::
                                        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                        ::operator()((
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&gtest_ar,
                                                  (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)gtest_ar._0_8_);
                                      }
                                      p1 = (void *)(ulong)((uint)local_60.data_ & 0x3f);
                                      p2._0_4_ = 0;
                                      testing::internal::CmpHelperEQ<unsigned_long,int>
                                                ((internal *)auStack_48,
                                                 "(((size_t)poveraligned) % kOveralignment)","0",
                                                 (unsigned_long *)&p1,(int *)&p2);
                                      if (auStack_48[0] == (internal)0x0) {
                                        testing::Message::Message((Message *)&p1);
                                        if (gtest_ar._0_8_ == 0) {
                                          pcVar8 = "";
                                        }
                                        else {
                                          pcVar8 = *(char **)gtest_ar._0_8_;
                                        }
                                        testing::internal::AssertHelper::AssertHelper
                                                  ((AssertHelper *)&p2,kFatalFailure,
                                                                                                      
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/src/tests/tcmalloc_unittest.cc"
                                                  ,0x602,pcVar8);
                                        testing::internal::AssertHelper::operator=
                                                  ((AssertHelper *)&p2,(Message *)&p1);
                                      }
                                      else {
                                        if (gtest_ar._0_8_ != 0) {
                                          std::
                                          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                          ::operator()((
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&gtest_ar,
                                                  (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)gtest_ar._0_8_);
                                        }
                                        VerifyNewHookWasCalled();
                                        operator_delete(local_60.data_,0x80,0x40);
                                        VerifyDeleteHookWasCalled();
                                        auStack_48 = (undefined1  [8])operator_new__(0x500,0x40);
                                        (*noopt_helper)(auStack_48);
                                        local_60.data_ = (AssertHelperData *)auStack_48;
                                        p1 = (void *)0x0;
                                        testing::internal::
                                        CmpHelperNE<overaligned_type*,decltype(nullptr)>
                                                  ((internal *)auStack_48,"poveraligned","nullptr",
                                                   (overaligned_type **)&local_60,&p1);
                                        if (auStack_48[0] == (internal)0x0) {
                                          testing::Message::Message((Message *)&p1);
                                          if (gtest_ar._0_8_ == 0) {
                                            pcVar8 = "";
                                          }
                                          else {
                                            pcVar8 = *(char **)gtest_ar._0_8_;
                                          }
                                          testing::internal::AssertHelper::AssertHelper
                                                    ((AssertHelper *)&p2,kFatalFailure,
                                                                                                          
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/src/tests/tcmalloc_unittest.cc"
                                                  ,0x608,pcVar8);
                                          testing::internal::AssertHelper::operator=
                                                    ((AssertHelper *)&p2,(Message *)&p1);
                                        }
                                        else {
                                          if (gtest_ar._0_8_ != 0) {
                                            std::
                                            default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                            ::operator()((
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&gtest_ar,
                                                  (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)gtest_ar._0_8_);
                                          }
                                          p1 = (void *)(ulong)((uint)local_60.data_ & 0x3f);
                                          p2._0_4_ = 0;
                                          testing::internal::CmpHelperEQ<unsigned_long,int>
                                                    ((internal *)auStack_48,
                                                     "(((size_t)poveraligned) % kOveralignment)","0"
                                                     ,(unsigned_long *)&p1,(int *)&p2);
                                          if (auStack_48[0] == (internal)0x0) {
                                            testing::Message::Message((Message *)&p1);
                                            if (gtest_ar._0_8_ == 0) {
                                              pcVar8 = "";
                                            }
                                            else {
                                              pcVar8 = *(char **)gtest_ar._0_8_;
                                            }
                                            testing::internal::AssertHelper::AssertHelper
                                                      ((AssertHelper *)&p2,kFatalFailure,
                                                                                                              
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/src/tests/tcmalloc_unittest.cc"
                                                  ,0x609,pcVar8);
                                            testing::internal::AssertHelper::operator=
                                                      ((AssertHelper *)&p2,(Message *)&p1);
                                          }
                                          else {
                                            if (gtest_ar._0_8_ != 0) {
                                              std::
                                              default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                              ::operator()((
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&gtest_ar,
                                                  (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)gtest_ar._0_8_);
                                            }
                                            VerifyNewHookWasCalled();
                                            operator_delete__(local_60.data_,0x500,0x40);
                                            VerifyDeleteHookWasCalled();
                                            auStack_48 = (undefined1  [8])
                                                         strdup("in memory of James Golick");
                                            (*noopt_helper)(auStack_48);
                                            poveraligned = (overaligned_type *)auStack_48;
                                            p1 = (void *)0x0;
                                            testing::internal::CmpHelperNE<char*,decltype(nullptr)>
                                                      ((internal *)auStack_48,"p2","nullptr",
                                                       (char **)&poveraligned,&p1);
                                            if (auStack_48[0] != (internal)0x0) {
                                              if (gtest_ar._0_8_ != 0) {
                                                std::
                                                default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                ::operator()((
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&gtest_ar,
                                                  (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)gtest_ar._0_8_);
                                              }
                                              VerifyNewHookWasCalled();
                                              this_00 = (
                                                  Cleanup<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_alk[P]gperftools_src_tests_tcmalloc_unittest_cc:1356:30)>
                                                  *)poveraligned;
                                              free(poveraligned);
                                              VerifyDeleteHookWasCalled();
                                              tcmalloc::
                                              Cleanup<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/src/tests/tcmalloc_unittest.cc:1356:30)>
                                              ::~Cleanup(this_00);
                                              puts("Testing large allocation");
                                              poveraligned = (overaligned_type *)
                                                             AllocatorState::alloc
                                                                       ((AllocatorState *)local_a8,
                                                                        0x6400000);
                                              actual_p1_size = 0;
                                              testing::internal::
                                              CmpHelperNE<void*,decltype(nullptr)>
                                                        ((internal *)auStack_48,"p","nullptr",
                                                         &poveraligned,(void **)&actual_p1_size);
                                              if (auStack_48[0] != (internal)0x0) {
                                                if (gtest_ar._0_8_ != 0) {
                                                  std::
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  ::operator()((
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&gtest_ar,
                                                  (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)gtest_ar._0_8_);
                                                }
                                                free(poveraligned);
                                                puts("Testing calloc");
                                                TestCalloc(0,0,true);
                                                TestCalloc(0,1,true);
                                                TestCalloc(1,1,true);
                                                TestCalloc(0x400,0,true);
                                                TestCalloc(0x100000,0,true);
                                                TestCalloc(0,0x400,true);
                                                TestCalloc(0,0x100000,true);
                                                TestCalloc(0x100000,2,true);
                                                TestCalloc(2,0x100000,true);
                                                TestCalloc(1000,1000,true);
                                                TestCalloc(0xffffffffffffffff,2,false);
                                                TestCalloc(2,0xffffffffffffffff,false);
                                                TestCalloc(0xffffffffffffffff,0xffffffffffffffff,
                                                           false);
                                                TestCalloc(0x7fffffffffffffff,3,false);
                                                TestCalloc(3,0x7fffffffffffffff,false);
                                                TestCalloc(0x7fffffffffffffff,0x7fffffffffffffff,
                                                           false);
                                                puts("Testing huge allocations");
                                                TestHugeAllocations((AllocatorState *)local_a8);
                                                pTVar6 = tcmalloc::TestingPortal::Get();
                                                cVar3 = (**(code **)(*(long *)pTVar6 + 8))(pTVar6);
                                                if (cVar3 == '\0') {
                                                  poveraligned = (overaligned_type *)
                                                                 anon_var_dwarf_1a0ba;
                                                  puts("Testing out of memory");
                                                  anon_unknown.dwarf_1e1ee::NumericProperty::
                                                  Override((NumericProperty *)auStack_48,
                                                           (size_t)&poveraligned);
                                                  size = 0;
                                                  while (__ptr = AllocatorState::alloc
                                                                           ((AllocatorState *)
                                                                            local_a8,size),
                                                        __ptr != (void *)0x0) {
                                                    free(__ptr);
                                                    size = size + 0xa00000;
                                                  }
                                                  tcmalloc::
                                                  Cleanup<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/src/tests/tcmalloc_unittest.cc:151:30)>
                                                  ::~Cleanup((
                                                  Cleanup<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_alk[P]gperftools_src_tests_tcmalloc_unittest_cc:151:30)>
                                                  *)auStack_48);
                                                }
                                                goto LAB_001112e7;
                                              }
                                              testing::Message::Message((Message *)&actual_p1_size);
                                              if (gtest_ar._0_8_ == 0) {
                                                pcVar8 = "";
                                              }
                                              else {
                                                pcVar8 = *(char **)gtest_ar._0_8_;
                                              }
                                              testing::internal::AssertHelper::AssertHelper
                                                        ((AssertHelper *)&rnd.memalign_fraction_,
                                                         kFatalFailure,
                                                                                                                  
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/src/tests/tcmalloc_unittest.cc"
                                                  ,0x621,pcVar8);
                                              testing::internal::AssertHelper::operator=
                                                        ((AssertHelper *)&rnd.memalign_fraction_,
                                                         (Message *)&actual_p1_size);
                                              goto LAB_001111a2;
                                            }
                                            testing::Message::Message((Message *)&p1);
                                            if (gtest_ar._0_8_ == 0) {
                                              pcVar8 = "";
                                            }
                                            else {
                                              pcVar8 = *(char **)gtest_ar._0_8_;
                                            }
                                            testing::internal::AssertHelper::AssertHelper
                                                      ((AssertHelper *)&p2,kFatalFailure,
                                                                                                              
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/src/tests/tcmalloc_unittest.cc"
                                                  ,0x615,pcVar8);
                                            testing::internal::AssertHelper::operator=
                                                      ((AssertHelper *)&p2,(Message *)&p1);
                                          }
                                        }
                                      }
                                    }
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
            testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&p2);
            this_02.data_ = (AssertHelperData *)p1;
          }
        }
        if (this_02.data_ != (AssertHelperData *)0x0) {
          (**(code **)(*(long *)this_02.data_ + 8))();
        }
        if (gtest_ar._0_8_ != 0) {
          this_02.data_ = (AssertHelperData *)&gtest_ar;
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)this_02.data_,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       gtest_ar._0_8_);
        }
        tcmalloc::
        Cleanup<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/src/tests/tcmalloc_unittest.cc:1356:30)>
        ::~Cleanup((Cleanup<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_alk[P]gperftools_src_tests_tcmalloc_unittest_cc:1356:30)>
                    *)this_02.data_);
        goto LAB_001112e7;
      }
      testing::Message::Message((Message *)&rnd.memalign_fraction_);
      if (gtest_ar._0_8_ == 0) {
        pcVar8 = "";
      }
      else {
        pcVar8 = *(char **)gtest_ar._0_8_;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_60,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/src/tests/tcmalloc_unittest.cc"
                 ,0x523,pcVar8);
      testing::internal::AssertHelper::operator=(&local_60,(Message *)&rnd.memalign_fraction_);
    }
    testing::internal::AssertHelper::~AssertHelper(&local_60);
    plVar7 = (long *)rnd.memalign_fraction_;
  }
  if (plVar7 != (long *)0x0) {
    (**(code **)(*plVar7 + 8))();
  }
  if (gtest_ar._0_8_ != 0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&gtest_ar,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)gtest_ar._0_8_
                );
  }
LAB_001112e7:
  std::vector<TestHarness::Type,_std::allocator<TestHarness::Type>_>::~vector
            ((vector<TestHarness::Type,_std::allocator<TestHarness::Type>_> *)&rnd);
  return;
}

Assistant:

TEST(TCMallocTest, AllTests) {
  AllocatorState rnd(100);

  // Check that empty allocation works
  printf("Testing empty allocation\n");
  {
    void* p1 = rnd.alloc(0);
    ASSERT_NE(p1, nullptr);
    void* p2 = rnd.alloc(0);
    ASSERT_NE(p2, nullptr);
    ASSERT_NE(p1, p2);
    free(p1);
    free(p2);
  }

  // This code stresses some of the memory allocation via STL.
  // It may call operator delete(void*, nothrow_t).
  printf("Testing STL use\n");
  {
    std::vector<int> v;
    v.push_back(1);
    v.push_back(2);
    v.push_back(3);
    v.push_back(0);
    std::stable_sort(v.begin(), v.end());
  }

#ifdef ENABLE_SIZED_DELETE
  {
    printf("Testing large sized delete is not crashing\n");
    // Large sized delete
    // case. https://github.com/gperftools/gperftools/issues/1254
    std::vector<char*> addresses;
    constexpr int kSizedDepth = 1024;
    addresses.reserve(kSizedDepth);
    for (int i = 0; i < kSizedDepth; i++) {
      addresses.push_back(noopt(new char[12686]));
    }
    for (int i = 0; i < kSizedDepth; i++) {
      ::operator delete[](addresses[i], 12686);
    }
  }
#endif

  // Test each of the memory-allocation functions once, just as a sanity-check
  printf("Sanity-testing all the memory allocation functions\n");
  {
    // We use new-hook and delete-hook to verify we actually called the
    // tcmalloc version of these routines, and not the libc version.
    SetNewHook();      // defined as part of MAKE_HOOK_CALLBACK, above
    SetDeleteHook();   // ditto
    tcmalloc::Cleanup unhook([] () {
      // Reset the hooks to what they used to be.  These are all
      // defined as part of MAKE_HOOK_CALLBACK, above.
      ResetNewHook();
      ResetDeleteHook();
    });

    void* p1 = noopt(malloc)(10);
    ASSERT_NE(p1, nullptr);    // force use of this variable
    VerifyNewHookWasCalled();
    // Also test the non-standard tc_malloc_size
    size_t actual_p1_size = tc_malloc_size(p1);
    ASSERT_GE(actual_p1_size, 10);
    ASSERT_LT(actual_p1_size, 100000);   // a reasonable upper-bound, I think
    free(p1);
    VerifyDeleteHookWasCalled();

    p1 = noopt(malloc)(10);
    ASSERT_NE(p1, nullptr);
    VerifyNewHookWasCalled();
    tc_free_sized(p1, 10);
    VerifyDeleteHookWasCalled();

    // sadly windows stuff lacks aligned_alloc
    // (https://learn.microsoft.com/en-us/cpp/standard-library/cstdlib?view=msvc-170#remarks-6)
    p1 = noopt(tc_memalign)(1, 10);
    ASSERT_NE(p1, nullptr);
    VerifyNewHookWasCalled();
    tc_free_aligned_sized(p1, 1, 10);
    VerifyDeleteHookWasCalled();

    p1 = tc_malloc_skip_new_handler(10);
    ASSERT_NE(p1, nullptr);
    VerifyNewHookWasCalled();
    free(p1);
    VerifyDeleteHookWasCalled();

    p1 = noopt(calloc)(10, 2);
    ASSERT_NE(p1, nullptr);
    VerifyNewHookWasCalled();
    // We make sure we realloc to a big size, since some systems (OS
    // X) will notice if the realloced size continues to fit into the
    // malloc-block and make this a noop if so.
    p1 = noopt(realloc)(p1, 30000);
    ASSERT_NE(p1, nullptr);
    VerifyNewHookWasCalled();
    VerifyDeleteHookWasCalled();
    free(p1);
    VerifyDeleteHookWasCalled();

    if (kOSSupportsMemalign) {
      ASSERT_EQ(noopt(PosixMemalign)(&p1, sizeof(p1), 40), 0);
      ASSERT_NE(p1, nullptr);
      VerifyNewHookWasCalled();
      free(p1);
      VerifyDeleteHookWasCalled();

      p1 = noopt(Memalign)(sizeof(p1) * 2, 50);
      ASSERT_NE(p1, nullptr);
      VerifyNewHookWasCalled();
      free(p1);
      VerifyDeleteHookWasCalled();
    }

    // Windows has _aligned_malloc.  Let's test that that's captured too.
#if (defined(_MSC_VER) || defined(__MINGW32__)) && !defined(PERFTOOLS_NO_ALIGNED_MALLOC)
    p1 = noopt(_aligned_malloc)(sizeof(p1) * 2, 64);
    ASSERT_NE(p1, nullptr);
    VerifyNewHookWasCalled();
    _aligned_free(p1);
    VerifyDeleteHookWasCalled();
#endif

    p1 = noopt(valloc(60));
    ASSERT_NE(p1, nullptr);
    VerifyNewHookWasCalled();
    free(p1);
    VerifyDeleteHookWasCalled();

    p1 = noopt(pvalloc(70));
    ASSERT_NE(p1, nullptr);
    VerifyNewHookWasCalled();
    free(p1);
    VerifyDeleteHookWasCalled();

    char* p2 = noopt(new char);
    ASSERT_NE(p2, nullptr);
    VerifyNewHookWasCalled();
    delete p2;
    VerifyDeleteHookWasCalled();

    p2 = noopt(new char[100]);
    ASSERT_NE(p2, nullptr);
    VerifyNewHookWasCalled();
    delete[] p2;
    VerifyDeleteHookWasCalled();

    p2 = noopt(new (std::nothrow) char);
    ASSERT_NE(p2, nullptr);
    VerifyNewHookWasCalled();
    delete p2;
    VerifyDeleteHookWasCalled();

    p2 = noopt(new (std::nothrow) char[100]);
    ASSERT_NE(p2, nullptr);
    VerifyNewHookWasCalled();
    delete[] p2;
    VerifyDeleteHookWasCalled();

    // Another way of calling operator new
    p2 = noopt(static_cast<char*>(::operator new(100)));
    ASSERT_NE(p2, nullptr);
    VerifyNewHookWasCalled();
    ::operator delete(p2);
    VerifyDeleteHookWasCalled();

    // Try to call nothrow's delete too.  Compilers use this.
    p2 = noopt(static_cast<char*>(::operator new(100, std::nothrow)));
    ASSERT_NE(p2, nullptr);
    VerifyNewHookWasCalled();
    ::operator delete(p2, std::nothrow);
    VerifyDeleteHookWasCalled();

#ifdef ENABLE_SIZED_DELETE
    p2 = noopt(new char);
    ASSERT_NE(p2, nullptr);
    VerifyNewHookWasCalled();
    ::operator delete(p2, sizeof(char));
    VerifyDeleteHookWasCalled();

    p2 = noopt(new char[100]);
    ASSERT_NE(p2, nullptr);
    VerifyNewHookWasCalled();
    ::operator delete[](p2, sizeof(char) * 100);
    VerifyDeleteHookWasCalled();
#endif

    overaligned_type* poveraligned = noopt(new overaligned_type);
    ASSERT_NE(poveraligned, nullptr);
    ASSERT_EQ((((size_t)poveraligned) % kOveralignment), 0);
    VerifyNewHookWasCalled();
    delete poveraligned;
    VerifyDeleteHookWasCalled();

    poveraligned = noopt(new overaligned_type[10]);
    ASSERT_NE(poveraligned, nullptr);
    ASSERT_EQ((((size_t)poveraligned) % kOveralignment), 0);
    VerifyNewHookWasCalled();
    delete[] poveraligned;
    VerifyDeleteHookWasCalled();

    poveraligned = noopt(new(std::nothrow) overaligned_type);
    ASSERT_NE(poveraligned, nullptr);
    ASSERT_EQ((((size_t)poveraligned) % kOveralignment), 0);
    VerifyNewHookWasCalled();
    delete poveraligned;
    VerifyDeleteHookWasCalled();

    poveraligned = noopt(new(std::nothrow) overaligned_type[10]);
    ASSERT_NE(poveraligned, nullptr);
    ASSERT_EQ((((size_t)poveraligned) % kOveralignment), 0);
    VerifyNewHookWasCalled();
    delete[] poveraligned;
    VerifyDeleteHookWasCalled();

    // Another way of calling operator new
    p2 = noopt(static_cast<char*>(::operator new(100, std::align_val_t(kOveralignment))));
    ASSERT_NE(p2, nullptr);
    ASSERT_EQ((((size_t)p2) % kOveralignment), 0);
    VerifyNewHookWasCalled();
    ::operator delete(p2, std::align_val_t(kOveralignment));
    VerifyDeleteHookWasCalled();

    p2 = noopt(static_cast<char*>(::operator new(100, std::align_val_t(kOveralignment), std::nothrow)));
    ASSERT_NE(p2, nullptr);
    ASSERT_EQ((((size_t)p2) % kOveralignment), 0);
    VerifyNewHookWasCalled();
    ::operator delete(p2, std::align_val_t(kOveralignment), std::nothrow);
    VerifyDeleteHookWasCalled();

    poveraligned = noopt(new overaligned_type);
    ASSERT_NE(poveraligned, nullptr);
    ASSERT_EQ((((size_t)poveraligned) % kOveralignment), 0);
    VerifyNewHookWasCalled();
    ::operator delete(poveraligned, sizeof(overaligned_type), std::align_val_t(kOveralignment));
    VerifyDeleteHookWasCalled();

    poveraligned = noopt(new overaligned_type[10]);
    ASSERT_NE(poveraligned, nullptr);
    ASSERT_EQ((((size_t)poveraligned) % kOveralignment), 0);
    VerifyNewHookWasCalled();
    ::operator delete[](poveraligned, sizeof(overaligned_type) * 10, std::align_val_t(kOveralignment));
    VerifyDeleteHookWasCalled();

// On AIX user defined malloc replacement of libc routines
// cannot be done at link time must be done a runtime via
// environment variable MALLOCTYPE
#if !defined(_AIX)
    // Try strdup(), which the system allocates but we must free.  If
    // all goes well, libc will use our malloc!
    p2 = noopt(strdup("in memory of James Golick"));
    ASSERT_NE(p2, nullptr);
    VerifyNewHookWasCalled();
    free(p2);
    VerifyDeleteHookWasCalled();
#endif
  }

  // Check that "lots" of memory can be allocated
  printf("Testing large allocation\n");
  {
    const int mb_to_allocate = 100;
    void* p = rnd.alloc(mb_to_allocate << 20);
    ASSERT_NE(p, nullptr);  // could not allocate
    free(p);
  }

  // Check calloc() with various arguments
  printf("Testing calloc\n");
  TestCalloc(0, 0, true);
  TestCalloc(0, 1, true);
  TestCalloc(1, 1, true);
  TestCalloc(1<<10, 0, true);
  TestCalloc(1<<20, 0, true);
  TestCalloc(0, 1<<10, true);
  TestCalloc(0, 1<<20, true);
  TestCalloc(1<<20, 2, true);
  TestCalloc(2, 1<<20, true);
  TestCalloc(1000, 1000, true);

  TestCalloc(kMaxSize, 2, false);
  TestCalloc(2, kMaxSize, false);
  TestCalloc(kMaxSize, kMaxSize, false);

  TestCalloc(kMaxSignedSize, 3, false);
  TestCalloc(3, kMaxSignedSize, false);
  TestCalloc(kMaxSignedSize, kMaxSignedSize, false);

  // Do the memory intensive tests after threads are done, since exhausting
  // the available address space can make pthread_create to fail.

  // Check that huge allocations fail with nullptr instead of crashing
  printf("Testing huge allocations\n");
  TestHugeAllocations(&rnd);

  // Check that large allocations fail with nullptr instead of crashing
  //
  // debug allocation takes forever for huge allocs
  if (!TestingPortal::Get()->IsDebuggingMalloc()) {
    constexpr NumericProperty kHeapLimitMB{"tcmalloc.heap_limit_mb"};
    printf("Testing out of memory\n");
    tcmalloc::Cleanup cleanup_limit = kHeapLimitMB.Override(1<<10); // 1 gig. Note, this is in megs.
    // Don't exercise more than 1 gig, no need to.
    for (int s = 0; ; s += (10<<20)) {
      void* large_object = rnd.alloc(s);
      if (large_object == nullptr) {
        break;
      }
      free(large_object);
    }
  }
}